

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.hh
# Opt level: O0

void __thiscall QPDFObjectHandle::QPDFDictItems::iterator::~iterator(iterator *this)

{
  iterator *this_local;
  
  this->_vptr_iterator = (_func_int **)&PTR__iterator_0058c000;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  ::~pair(&this->ivalue);
  std::shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members>::~shared_ptr(&this->m);
  return;
}

Assistant:

virtual ~iterator() = default;